

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cab_manager.cpp
# Opt level: O3

shared_ptr<cab> __thiscall
cab_manager::find_cab(cab_manager *this,node_type src,node_type dst,uint32_t passengers)

{
  _Atomic_word *p_Var1;
  int iVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  undefined8 *puVar4;
  pointer pnVar5;
  int iVar6;
  uint32_t uVar7;
  int32_t iVar8;
  mapped_type *__x;
  long lVar9;
  long lVar10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  pointer pnVar11;
  uint uVar12;
  uint uVar13;
  undefined7 in_register_00000031;
  int in_R8D;
  undefined8 *puVar14;
  bool bVar15;
  shared_ptr<cab> sVar16;
  node_type current;
  node_type n;
  shared_ptr<cab> shared;
  vector<node_type,_std::allocator<node_type>_> vec;
  deque<node_type,_std::allocator<node_type>_> queue;
  vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_> cabs;
  _Deque_iterator<node_type,_node_type_&,_node_type_*> it;
  node_type local_14f;
  node_type local_14e;
  node_type local_14d;
  uint local_14c;
  cab_manager *local_148;
  size_type *local_140;
  uint local_134;
  uint32_t local_130;
  int local_12c;
  cab *local_128;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_120;
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  long local_100;
  long local_f8;
  vector<node_type,_std::allocator<node_type>_> local_f0;
  _Deque_base<node_type,_std::allocator<node_type>_> local_d8;
  map<node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>,_std::less<node_type>,_std::allocator<std::pair<const_node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>_>_>
  *local_88;
  road_network *local_80;
  vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_> local_78;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  cab *local_50 [4];
  
  local_100 = CONCAT71(in_register_00000031,src);
  local_d8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_14f = dst;
  local_130 = passengers;
  local_12c = in_R8D;
  std::_Deque_base<node_type,_std::allocator<node_type>_>::_M_initialize_map(&local_d8,0);
  if ((cab *)local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      (cab *)(local_d8._M_impl.super__Deque_impl_data._M_finish._M_last + -1)) {
    std::deque<node_type,std::allocator<node_type>>::_M_push_back_aux<node_type_const&>
              ((deque<node_type,std::allocator<node_type>> *)&local_d8,&local_14f);
  }
  else {
    *(node_type *)(id_type *)local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur = dst;
    local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
         (_Elt_pointer)
         ((long)(id_type *)local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1);
  }
  local_88 = (map<node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>,_std::less<node_type>,_std::allocator<std::pair<const_node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>_>_>
              *)(local_100 + 0x40);
  local_f8 = local_100 + 0x48;
  local_140 = &(this->_cabs)._M_h._M_bucket_count;
  local_80 = (road_network *)(local_100 + 0x70);
  uVar12 = 0;
  local_148 = this;
  do {
    if (local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_d8._M_impl.super__Deque_impl_data._M_start._M_cur) break;
    local_14e = (node_type)*(id_type *)local_d8._M_impl.super__Deque_impl_data._M_start._M_cur;
    if ((cab *)local_d8._M_impl.super__Deque_impl_data._M_start._M_cur ==
        (cab *)((long)local_d8._M_impl.super__Deque_impl_data._M_start._M_last + -1)) {
      operator_delete(local_d8._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
      local_d8._M_impl.super__Deque_impl_data._M_start._M_cur =
           local_d8._M_impl.super__Deque_impl_data._M_start._M_node[1];
      local_d8._M_impl.super__Deque_impl_data._M_start._M_last =
           (_Elt_pointer)
           &(((cab *)((long)local_d8._M_impl.super__Deque_impl_data._M_start._M_cur + 0x1e0))->
            _route).super__Vector_base<node_type,_std::allocator<node_type>_>._M_impl.
            super__Vector_impl_data._M_finish;
      local_d8._M_impl.super__Deque_impl_data._M_start._M_first =
           local_d8._M_impl.super__Deque_impl_data._M_start._M_cur;
      local_d8._M_impl.super__Deque_impl_data._M_start._M_node =
           local_d8._M_impl.super__Deque_impl_data._M_start._M_node + 1;
    }
    else {
      local_d8._M_impl.super__Deque_impl_data._M_start._M_cur =
           (_Elt_pointer)
           ((long)(id_type *)local_d8._M_impl.super__Deque_impl_data._M_start._M_cur + 1);
    }
    (this->_cabs)._M_h._M_buckets = (__buckets_ptr)0x0;
    (this->_cabs)._M_h._M_bucket_count = 0;
    lVar9 = *(long *)(local_100 + 0x50);
    lVar10 = local_f8;
    uVar13 = uVar12;
    if (lVar9 != 0) {
      do {
        bVar15 = *(node_type *)(lVar9 + 0x20) < local_14e;
        if (!bVar15) {
          lVar10 = lVar9;
        }
        lVar9 = *(long *)(lVar9 + 0x10 + (ulong)bVar15 * 8);
      } while (lVar9 != 0);
      if ((lVar10 != local_f8) && (*(node_type *)(lVar10 + 0x20) <= local_14e)) {
        __x = std::
              map<node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>,_std::less<node_type>,_std::allocator<std::pair<const_node_type,_std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>_>_>_>
              ::operator[](local_88,&local_14e);
        std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>::vector(&local_78,__x)
        ;
        puVar14 = (undefined8 *)
                  CONCAT44(local_78.
                           super__Vector_base<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,
                           local_78.
                           super__Vector_base<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._0_4_);
        puVar4 = (undefined8 *)
                 CONCAT44(local_78.
                          super__Vector_base<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                          local_78.
                          super__Vector_base<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish._0_4_);
        if (puVar14 == puVar4) {
          std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>::~vector(&local_78);
          this = local_148;
        }
        else {
          local_14c = 0x7fffffff;
          local_134 = uVar12;
          do {
            local_128 = (cab *)*puVar14;
            p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar14[1];
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var3->_M_weak_count = p_Var3->_M_weak_count + 1;
              UNLOCK();
            }
            else {
              p_Var3->_M_weak_count = p_Var3->_M_weak_count + 1;
            }
            iVar6 = p_Var3->_M_use_count;
            do {
              LOCK();
              iVar2 = p_Var3->_M_use_count;
              bVar15 = iVar6 == iVar2;
              if (bVar15) {
                p_Var3->_M_use_count = iVar6 + 1;
                iVar2 = iVar6;
              }
              iVar6 = iVar2;
              UNLOCK();
            } while (!bVar15);
            _Stack_120._M_pi = p_Var3;
            uVar7 = cab::passengers_at_node(local_128,local_14f);
            if (uVar7 + local_12c < 5) {
              iVar8 = cab::calculate_costs(local_128,local_14f,(node_type)local_130);
              uVar7 = cab::costs(local_128);
              if (iVar8 - uVar7 < local_14c) {
                uVar7 = cab::costs(local_128);
                (local_148->_cabs)._M_h._M_buckets = (__buckets_ptr)local_128;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_140,&_Stack_120);
                local_14c = iVar8 - uVar7;
              }
            }
            if (_Stack_120._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_120._M_pi);
            }
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var1 = &p_Var3->_M_weak_count;
              iVar6 = *p_Var1;
              *p_Var1 = *p_Var1 + -1;
              UNLOCK();
            }
            else {
              iVar6 = p_Var3->_M_weak_count;
              p_Var3->_M_weak_count = iVar6 + -1;
            }
            if (iVar6 == 1) {
              (*p_Var3->_vptr__Sp_counted_base[3])(p_Var3);
            }
            puVar14 = puVar14 + 2;
          } while (puVar14 != puVar4);
          std::vector<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>::~vector(&local_78);
          this = local_148;
          uVar13 = local_134;
          if (local_14c != 0x7fffffff) goto LAB_00165139;
        }
      }
    }
    road_network::get_predecessors(&local_f0,local_80,local_14e);
    pnVar5 = local_f0.super__Vector_base<node_type,_std::allocator<node_type>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pnVar11 = local_f0.super__Vector_base<node_type,_std::allocator<node_type>_>._M_impl.
                   super__Vector_impl_data._M_start; pnVar11 != pnVar5; pnVar11 = pnVar11 + 1) {
      local_14d = *pnVar11;
      local_78.super__Vector_base<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ =
           local_d8._M_impl.super__Deque_impl_data._M_start._M_cur._0_4_;
      local_78.super__Vector_base<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ =
           local_d8._M_impl.super__Deque_impl_data._M_start._M_cur._4_4_;
      local_78.super__Vector_base<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ =
           local_d8._M_impl.super__Deque_impl_data._M_start._M_first._0_4_;
      local_78.super__Vector_base<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ =
           local_d8._M_impl.super__Deque_impl_data._M_start._M_first._4_4_;
      local_78.super__Vector_base<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ =
           local_d8._M_impl.super__Deque_impl_data._M_start._M_last._0_4_;
      local_78.super__Vector_base<std::weak_ptr<cab>,_std::allocator<std::weak_ptr<cab>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           local_d8._M_impl.super__Deque_impl_data._M_start._M_last._4_4_;
      uStack_60 = local_d8._M_impl.super__Deque_impl_data._M_start._M_node._0_4_;
      uStack_5c = local_d8._M_impl.super__Deque_impl_data._M_start._M_node._4_4_;
      local_128 = (cab *)local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
      _Stack_120._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_d8._M_impl.super__Deque_impl_data._M_finish._M_first;
      local_118 = local_d8._M_impl.super__Deque_impl_data._M_finish._M_last._0_4_;
      uStack_114 = local_d8._M_impl.super__Deque_impl_data._M_finish._M_last._4_4_;
      uStack_110 = local_d8._M_impl.super__Deque_impl_data._M_finish._M_node._0_4_;
      uStack_10c = local_d8._M_impl.super__Deque_impl_data._M_finish._M_node._4_4_;
      std::
      __find_if<std::_Deque_iterator<node_type,node_type&,node_type*>,__gnu_cxx::__ops::_Iter_equals_val<node_type_const>>
                (local_50,&local_78,&local_128,&local_14d);
      if (local_50[0] == (cab *)local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur) {
        if ((cab *)local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            (cab *)(local_d8._M_impl.super__Deque_impl_data._M_finish._M_last + -1)) {
          std::deque<node_type,std::allocator<node_type>>::_M_push_back_aux<node_type_const&>
                    ((deque<node_type,std::allocator<node_type>> *)&local_d8,&local_14d);
        }
        else {
          *(node_type *)(id_type *)local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_14d;
          local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               (_Elt_pointer)
               ((long)(id_type *)local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1);
        }
      }
    }
    uVar12 = 1;
    if ((uVar13 & 1) != 0) {
      uVar12 = uVar13 & 0xff;
    }
    bVar15 = (node_type)*(id_type *)local_d8._M_impl.super__Deque_impl_data._M_start._M_cur ==
             local_14f;
    if (!bVar15) {
      uVar12 = uVar13 & 0xff;
    }
    if (local_f0.super__Vector_base<node_type,_std::allocator<node_type>_>._M_impl.
        super__Vector_impl_data._M_start != (node_type *)0x0) {
      operator_delete(local_f0.super__Vector_base<node_type,_std::allocator<node_type>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_f0.super__Vector_base<node_type,_std::allocator<node_type>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_f0.super__Vector_base<node_type,_std::allocator<node_type>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*local_140 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*local_140);
    }
  } while ((bVar15 & (byte)uVar13) == 0);
  (this->_cabs)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->_cabs)._M_h._M_bucket_count = 0;
LAB_00165139:
  std::_Deque_base<node_type,_std::allocator<node_type>_>::~_Deque_base(&local_d8);
  sVar16.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar16.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<cab>)sVar16.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<cab> cab_manager::find_cab(node_type src, node_type dst, std::uint32_t passengers)
{
    bool cycle = false;
    std::deque<node_type> queue;
    queue.push_back(src);

    while(!queue.empty())
    {
        node_type current = queue.front();
        queue.pop_front();

        std::int32_t min = INT32_MAX;
        std::shared_ptr<cab> chosen = nullptr;
        if(_cabs_at_node.find(current) != _cabs_at_node.end())
        {
            std::vector<std::weak_ptr<cab>> cabs = _cabs_at_node[current];
            for(auto cab : cabs)
            {
                auto shared = cab.lock();
                if(shared->passengers_at_node(src) + passengers > 4)
                {
                    continue;
                }

                // calculate cost
                std::int32_t cost = shared->calculate_costs(src, dst);
                if((cost - shared->costs()) < min)
                {
                    min = cost - shared->costs();
                    chosen = shared;
                }
            }
        }

        if(min != INT32_MAX)
        {
            return chosen;
        }

        std::vector<node_type> vec = _rnet.get_predecessors(current);
        for(auto n : vec)
        {
            auto it = std::find(queue.begin(), queue.end(), n);
            if(it == queue.end())
            {
                queue.push_back(n);
            }
        }

        // break after two cycles due to edge case src = P4
        if(queue.front() == src && cycle)
        {
            break;
        }
        else if (queue.front() == src && !cycle)
        {
            cycle = true;
        }
        
    }
    return nullptr;
}